

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

CtorDtorName * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::CtorDtorName,(anonymous_namespace)::Node*&,bool>
          (Db *this,Node **args,bool *args_1)

{
  bool bVar1;
  Node *pNVar2;
  CtorDtorName *pCVar3;
  
  pCVar3 = (CtorDtorName *)
           anon_unknown.dwarf_3a70a8::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  pNVar2 = *args;
  bVar1 = *args_1;
  (pCVar3->super_Node).K = KCtorDtorName;
  (pCVar3->super_Node).RHSComponentCache = No;
  (pCVar3->super_Node).ArrayCache = No;
  (pCVar3->super_Node).FunctionCache = No;
  (pCVar3->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001df360;
  pCVar3->Basename = pNVar2;
  pCVar3->IsDtor = bVar1;
  return pCVar3;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }